

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_chop_write(connectdata *conn,int type,char *ptr,size_t len)

{
  Curl_easy *data;
  CURLcode CVar1;
  size_t sVar2;
  curl_write_callback p_Var3;
  char *pcVar4;
  size_t sVar5;
  curl_write_callback p_Var6;
  
  if (len == 0) {
    return CURLE_OK;
  }
  data = conn->data;
  if (((data->req).keepon & 0x10) != 0) {
    if ((data->state).tempwritetype != type) {
      return CURLE_RECV_ERROR;
    }
    sVar5 = (data->state).tempwritesize + len;
    pcVar4 = (char *)(*Curl_crealloc)((data->state).tempwrite,sVar5);
    if (pcVar4 != (char *)0x0) {
      memcpy(pcVar4 + (data->state).tempwritesize,ptr,len);
      (data->state).tempwrite = pcVar4;
      (data->state).tempwritesize = sVar5;
      return CURLE_OK;
    }
    return CURLE_OUT_OF_MEMORY;
  }
  if ((type & 1U) == 0) {
    p_Var3 = (curl_write_callback)0x0;
  }
  else {
    p_Var3 = (data->set).fwrite_func;
  }
  if ((type & 2U) != 0) {
    p_Var6 = (data->set).fwrite_header;
    if (p_Var6 != (curl_write_callback)0x0) goto LAB_00112997;
    if ((data->set).writeheader != (void *)0x0) {
      p_Var6 = (data->set).fwrite_func;
      goto LAB_00112997;
    }
  }
  p_Var6 = (curl_write_callback)0x0;
LAB_00112997:
  do {
    if (len == 0) {
      return CURLE_OK;
    }
    sVar5 = 0x4000;
    if (len < 0x4000) {
      sVar5 = len;
    }
    if (p_Var3 != (curl_write_callback)0x0) {
      sVar2 = (*p_Var3)(ptr,1,sVar5,(data->set).out);
      if (sVar2 == 0x10000001) {
        if ((conn->handler->flags & 0x10) == 0) goto LAB_00112a46;
        pcVar4 = "Write callback asked for PAUSE when not supported!";
        goto LAB_00112a6c;
      }
      if (sVar2 != sVar5) {
        Curl_failf(data,"Failed writing body (%zu != %zu)",sVar2,sVar5);
        return CURLE_WRITE_ERROR;
      }
    }
    if (p_Var6 != (curl_write_callback)0x0) {
      sVar2 = (*p_Var6)(ptr,1,sVar5,(data->set).writeheader);
      if (sVar2 == 0x10000001) {
        type = 2;
LAB_00112a46:
        CVar1 = pausewrite(data,type,ptr,len);
        return CVar1;
      }
      if (sVar2 != sVar5) {
        pcVar4 = "Failed writing header";
LAB_00112a6c:
        Curl_failf(data,pcVar4);
        return CURLE_WRITE_ERROR;
      }
    }
    ptr = ptr + sVar5;
    len = len - sVar5;
  } while( true );
}

Assistant:

CURLcode Curl_client_chop_write(struct connectdata *conn,
                                int type,
                                char *ptr,
                                size_t len)
{
  struct Curl_easy *data = conn->data;
  curl_write_callback writeheader = NULL;
  curl_write_callback writebody = NULL;

  if(!len)
    return CURLE_OK;

  /* If reading is actually paused, we're forced to append this chunk of data
     to the already held data, but only if it is the same type as otherwise it
     can't work and it'll return error instead. */
  if(data->req.keepon & KEEP_RECV_PAUSE) {
    size_t newlen;
    char *newptr;
    if(type != data->state.tempwritetype)
      /* major internal confusion */
      return CURLE_RECV_ERROR;

    DEBUGASSERT(data->state.tempwrite);

    /* figure out the new size of the data to save */
    newlen = len + data->state.tempwritesize;
    /* allocate the new memory area */
    newptr = realloc(data->state.tempwrite, newlen);
    if(!newptr)
      return CURLE_OUT_OF_MEMORY;
    /* copy the new data to the end of the new area */
    memcpy(newptr + data->state.tempwritesize, ptr, len);
    /* update the pointer and the size */
    data->state.tempwrite = newptr;
    data->state.tempwritesize = newlen;
    return CURLE_OK;
  }

  /* Determine the callback(s) to use. */
  if(type & CLIENTWRITE_BODY)
    writebody = data->set.fwrite_func;
  if((type & CLIENTWRITE_HEADER) &&
     (data->set.fwrite_header || data->set.writeheader)) {
    /*
     * Write headers to the same callback or to the especially setup
     * header callback function (added after version 7.7.1).
     */
    writeheader =
      data->set.fwrite_header? data->set.fwrite_header: data->set.fwrite_func;
  }

  /* Chop data, write chunks. */
  while(len) {
    size_t chunklen = len <= CURL_MAX_WRITE_SIZE? len: CURL_MAX_WRITE_SIZE;

    if(writebody) {
      size_t wrote = writebody(ptr, 1, chunklen, data->set.out);

      if(CURL_WRITEFUNC_PAUSE == wrote) {
        if(conn->handler->flags & PROTOPT_NONETWORK) {
          /* Protocols that work without network cannot be paused. This is
             actually only FILE:// just now, and it can't pause since the
             transfer isn't done using the "normal" procedure. */
          failf(data, "Write callback asked for PAUSE when not supported!");
          return CURLE_WRITE_ERROR;
        }
        else
          return pausewrite(data, type, ptr, len);
      }
      else if(wrote != chunklen) {
        failf(data, "Failed writing body (%zu != %zu)", wrote, chunklen);
        return CURLE_WRITE_ERROR;
      }
    }

    if(writeheader) {
      size_t wrote = writeheader(ptr, 1, chunklen, data->set.writeheader);

      if(CURL_WRITEFUNC_PAUSE == wrote)
        /* here we pass in the HEADER bit only since if this was body as well
           then it was passed already and clearly that didn't trigger the
           pause, so this is saved for later with the HEADER bit only */
        return pausewrite(data, CLIENTWRITE_HEADER, ptr, len);

      if(wrote != chunklen) {
        failf(data, "Failed writing header");
        return CURLE_WRITE_ERROR;
      }
    }

    ptr += chunklen;
    len -= chunklen;
  }

  return CURLE_OK;
}